

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportBuildFileGenerator::GenerateMainFile(cmExportBuildFileGenerator *this,ostream *os)

{
  cmGeneratorTarget *target;
  bool bVar1;
  TargetType TVar2;
  PolicyStatus PVar3;
  ostream *poVar4;
  string *psVar5;
  reference ppcVar6;
  cmGlobalGenerator *pcVar7;
  cmake *pcVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference config;
  pair<std::_Rb_tree_const_iterator<cmGeneratorTarget_*>,_bool> pVar9;
  string *c;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  undefined1 local_508 [7];
  bool newCMP0022Behavior;
  undefined1 local_4f8 [8];
  string errorMessage;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  allocator<char> local_369;
  string local_368;
  undefined1 local_348 [8];
  ImportPropertyMap properties;
  cmGeneratorTarget *gte;
  iterator __end1_1;
  iterator __begin1_1;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingTargets;
  undefined1 local_2d8 [16];
  string local_2c8;
  undefined1 local_2a8 [8];
  ostringstream e;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  cmGeneratorTarget *local_b0;
  cmGeneratorTarget *te;
  string *tei;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  string sep;
  string expectedTargets;
  ostream *os_local;
  cmExportBuildFileGenerator *this_local;
  
  std::__cxx11::string::string((string *)(sep.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &targets.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_78);
  GetTargets(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_78);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_78);
  tei = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_78);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&tei), bVar1) {
    te = (cmGeneratorTarget *)
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    local_b0 = cmLocalGenerator::FindGeneratorTargetToUse(this->LG,(string *)te);
    std::operator+(&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &targets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   &(this->super_cmExportFileGenerator).Namespace);
    cmGeneratorTarget::GetExportName_abi_cxx11_(&local_110,local_b0);
    std::operator+(&local_d0,&local_f0,&local_110);
    std::__cxx11::string::operator+=((string *)(sep.field_2._M_local_buf + 8),(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::operator=
              ((string *)
               &targets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage," ");
    pVar9 = std::
            set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
            ::insert(&(this->super_cmExportFileGenerator).ExportedTargets,&local_b0);
    if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
      poVar4 = std::operator<<((ostream *)local_2a8,"given target \"");
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(local_b0);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      std::operator<<(poVar4,"\" more than once.");
      pcVar7 = cmLocalGenerator::GetGlobalGenerator(this->LG);
      pcVar8 = cmGlobalGenerator::GetCMakeInstance(pcVar7);
      std::__cxx11::ostringstream::str();
      cmLocalGenerator::GetMakefile(this->LG);
      cmMakefile::GetBacktrace((cmMakefile *)local_2d8);
      cmake::IssueMessage(pcVar8,FATAL_ERROR,(string *)(local_2d8 + 0x10),
                          (cmListFileBacktrace *)local_2d8);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_2d8);
      std::__cxx11::string::~string((string *)(local_2d8 + 0x10));
      this_local._7_1_ = 0;
      missingTargets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
      goto LAB_00390b7b;
    }
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::push_back
              (&this->Exports,&local_b0);
    TVar2 = GetExportTargetType(this,local_b0);
    if (TVar2 == INTERFACE_LIBRARY) {
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])(this,os,"3.0.0");
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xb])
            (this,os,(undefined1 *)((long)&sep.field_2 + 8));
  missingTargets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
LAB_00390b7b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  std::__cxx11::string::~string
            ((string *)
             &targets.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(sep.field_2._M_local_buf + 8));
  if (missingTargets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1_1);
    __end1_1 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                         (&this->Exports);
    gte = (cmGeneratorTarget *)
          std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                    (&this->Exports);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                               *)&gte), bVar1) {
      ppcVar6 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&__end1_1);
      target = *ppcVar6;
      properties._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)target;
      TVar2 = GetExportTargetType(this,target);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])
                (this,os,target,(ulong)TVar2);
      cmTarget::AppendBuildInterfaceIncludes
                (*(cmTarget **)properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_348);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_368,"INTERFACE_INCLUDE_DIRECTORIES",&local_369);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_368,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_348,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_1);
      std::__cxx11::string::~string((string *)&local_368);
      std::allocator<char>::~allocator(&local_369);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_390,"INTERFACE_SOURCES",&local_391);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_390,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_348,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_1);
      std::__cxx11::string::~string((string *)&local_390);
      std::allocator<char>::~allocator(&local_391);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b8,"INTERFACE_COMPILE_DEFINITIONS",&local_3b9);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_3b8,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_348,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_1);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::allocator<char>::~allocator(&local_3b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e0,"INTERFACE_COMPILE_OPTIONS",&local_3e1);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_3e0,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_348,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_1);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::allocator<char>::~allocator(&local_3e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_408,"INTERFACE_AUTOUIC_OPTIONS",&local_409);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_408,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_348,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_1);
      std::__cxx11::string::~string((string *)&local_408);
      std::allocator<char>::~allocator(&local_409);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_430,"INTERFACE_COMPILE_FEATURES",&local_431);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_430,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_348,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_1);
      std::__cxx11::string::~string((string *)&local_430);
      std::allocator<char>::~allocator(&local_431);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_458,"INTERFACE_LINK_OPTIONS",&local_459);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_458,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_348,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_1);
      std::__cxx11::string::~string((string *)&local_458);
      std::allocator<char>::~allocator(&local_459);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_480,"INTERFACE_LINK_DIRECTORIES",&local_481);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_480,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_348,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_1);
      std::__cxx11::string::~string((string *)&local_480);
      std::allocator<char>::~allocator(&local_481);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a8,"INTERFACE_LINK_DEPENDS",&local_4a9);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_4a8,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_348,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_1);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::allocator<char>::~allocator(&local_4a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4d0,"INTERFACE_POSITION_INDEPENDENT_CODE",
                 (allocator<char> *)(errorMessage.field_2._M_local_buf + 0xf));
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_4d0,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (ImportPropertyMap *)local_348);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::allocator<char>::~allocator((allocator<char> *)(errorMessage.field_2._M_local_buf + 0xf))
      ;
      std::__cxx11::string::string((string *)local_4f8);
      bVar1 = cmExportFileGenerator::PopulateExportProperties
                        (&this->super_cmExportFileGenerator,
                         (cmGeneratorTarget *)
                         properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (ImportPropertyMap *)local_348,(string *)local_4f8);
      if (bVar1) {
        PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0022
                          ((cmGeneratorTarget *)
                           properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
        bVar1 = false;
        if (PVar3 != WARN) {
          PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0022
                            ((cmGeneratorTarget *)
                             properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
          bVar1 = PVar3 != OLD;
        }
        if (bVar1) {
          cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                    (&this->super_cmExportFileGenerator,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,BuildInterface,
                     (ImportPropertyMap *)local_348,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1_1);
        }
        cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                  (&this->super_cmExportFileGenerator,
                   (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (ImportPropertyMap *)local_348);
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xf])
                  (this,properties._M_t._M_impl.super__Rb_tree_header._M_node_count,os,local_348);
        missingTargets.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
      else {
        pcVar7 = cmLocalGenerator::GetGlobalGenerator(this->LG);
        pcVar8 = cmGlobalGenerator::GetCMakeInstance(pcVar7);
        cmLocalGenerator::GetMakefile(this->LG);
        cmMakefile::GetBacktrace((cmMakefile *)local_508);
        cmake::IssueMessage(pcVar8,FATAL_ERROR,(string *)local_4f8,(cmListFileBacktrace *)local_508)
        ;
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_508);
        this_local._7_1_ = 0;
        missingTargets.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      }
      std::__cxx11::string::~string((string *)local_4f8);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_348);
      if (missingTargets.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_00391681;
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&__end1_1);
    }
    this_00 = &(this->super_cmExportFileGenerator).Configurations;
    __end1_2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_00);
    c = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_2,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&c), bVar1) {
      config = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1_2);
      cmExportFileGenerator::GenerateImportConfig
                (&this->super_cmExportFileGenerator,os,config,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_1);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1_2);
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])(this,os,&__range1_1);
    this_local._7_1_ = 1;
    missingTargets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
LAB_00391681:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1_1);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmExportBuildFileGenerator::GenerateMainFile(std::ostream& os)
{
  {
    std::string expectedTargets;
    std::string sep;
    std::vector<std::string> targets;
    this->GetTargets(targets);
    for (std::string const& tei : targets) {
      cmGeneratorTarget* te = this->LG->FindGeneratorTargetToUse(tei);
      expectedTargets += sep + this->Namespace + te->GetExportName();
      sep = " ";
      if (this->ExportedTargets.insert(te).second) {
        this->Exports.push_back(te);
      } else {
        std::ostringstream e;
        e << "given target \"" << te->GetName() << "\" more than once.";
        this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR, e.str(),
          this->LG->GetMakefile()->GetBacktrace());
        return false;
      }
      if (this->GetExportTargetType(te) == cmStateEnums::INTERFACE_LIBRARY) {
        this->GenerateRequiredCMakeVersion(os, "3.0.0");
      }
    }

    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  std::vector<std::string> missingTargets;

  // Create all the imported targets.
  for (cmGeneratorTarget* gte : this->Exports) {
    this->GenerateImportTargetCode(os, gte, this->GetExportTargetType(gte));

    gte->Target->AppendBuildInterfaceIncludes();

    ImportPropertyMap properties;

    this->PopulateInterfaceProperty("INTERFACE_INCLUDE_DIRECTORIES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_SOURCES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_LINK_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_LINK_DIRECTORIES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_LINK_DEPENDS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gte,
                                    properties);

    std::string errorMessage;
    if (!this->PopulateExportProperties(gte, properties, errorMessage)) {
      this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR, errorMessage,
        this->LG->GetMakefile()->GetBacktrace());
      return false;
    }

    const bool newCMP0022Behavior =
      gte->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gte->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      this->PopulateInterfaceLinkLibrariesProperty(
        gte, cmGeneratorExpression::BuildInterface, properties,
        missingTargets);
    }
    this->PopulateCompatibleInterfaceProperties(gte, properties);

    this->GenerateInterfaceProperties(gte, os, properties);
  }

  // Generate import file content for each configuration.
  for (std::string const& c : this->Configurations) {
    this->GenerateImportConfig(os, c, missingTargets);
  }

  this->GenerateMissingTargetsCheckCode(os, missingTargets);

  return true;
}